

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::queryFramebufferState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,GLenum pname
               ,QueriedState *state)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<int> local_34;
  
  if (type == QUERY_FRAMEBUFFER_INTEGER) {
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&local_34);
    glu::CallLogWrapper::glGetFramebufferParameteriv(gl,target,pname,&local_34.m_value);
    bVar1 = checkError(result,gl,"glGetVertexAttribiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity(&local_34,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER;
      (state->m_v).vInt = local_34.m_value;
    }
  }
  return;
}

Assistant:

void queryFramebufferState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_FRAMEBUFFER_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetFramebufferParameteriv(target, pname, &value);

			if (!checkError(result, gl, "glGetVertexAttribiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}